

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMAddressingModes.h
# Opt level: O0

float getFPImmFloat(uint Imm)

{
  uint uVar1;
  int iVar2;
  uint8_t Mantissa;
  uint8_t Exp;
  uint8_t Sign;
  anon_union_4_2_9472fca4 FPUnion;
  uint Imm_local;
  
  uVar1 = Imm >> 4;
  iVar2 = 0;
  if ((uVar1 & 4) != 0) {
    iVar2 = 0x1f;
  }
  return (float)((uint)((byte)Imm & 0xf) << 0x13 |
                (((byte)uVar1 & 7) & 3) << 0x17 |
                iVar2 << 0x19 |
                (uint)((uVar1 & 4) == 0) << 0x1e | (uint)((byte)(Imm >> 7) & 1) << 0x1f);
}

Assistant:

static inline float getFPImmFloat(unsigned Imm)
{
	// We expect an 8-bit binary encoding of a floating-point number here.
	union {
		uint32_t I;
		float F;
	} FPUnion;

	uint8_t Sign = (Imm >> 7) & 0x1;
	uint8_t Exp = (Imm >> 4) & 0x7;
	uint8_t Mantissa = Imm & 0xf;

	//   8-bit FP    iEEEE Float Encoding
	//   abcd efgh   aBbbbbbc defgh000 00000000 00000000
	//
	// where B = NOT(b);

	FPUnion.I = 0;
	FPUnion.I |= Sign << 31;
	FPUnion.I |= ((Exp & 0x4) != 0 ? 0 : 1) << 30;
	FPUnion.I |= ((Exp & 0x4) != 0 ? 0x1f : 0) << 25;
	FPUnion.I |= (Exp & 0x3) << 23;
	FPUnion.I |= Mantissa << 19;
	return FPUnion.F;
}